

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

Vector3d * __thiscall OpenMD::Thermo::getSystemDipole(Vector3d *__return_storage_ptr__,Thermo *this)

{
  double *pdVar1;
  Snapshot *this_00;
  bool bVar2;
  uint i;
  int iVar3;
  Molecule *pMVar4;
  long lVar5;
  long lVar6;
  Atom *pAVar7;
  pointer ppAVar8;
  int iVar9;
  Vector<double,_3U> result_1;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator miter;
  double local_150;
  Vector3d local_148;
  Vector3d local_128;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  FixedChargeAdapter local_88 [4];
  double local_68 [3];
  Vector3d *local_50;
  Thermo *local_48;
  FluctuatingChargeAdapter local_40;
  MoleculeIterator local_38;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  local_48 = this;
  if (this_00->hasSystemDipole == false) {
    iVar9 = 0;
    local_38._M_node = (_Base_ptr)0x0;
    local_128.super_Vector<double,_3U>.data_[2] = 0.0;
    local_128.super_Vector<double,_3U>.data_[0] = 0.0;
    local_128.super_Vector<double,_3U>.data_[1] = 0.0;
    local_68[2] = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_a8[2] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_c8[2] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_50 = __return_storage_ptr__;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_38);
    if (pMVar4 == (Molecule *)0x0) {
      local_108 = 0.0;
      uStack_100 = 0;
      iVar3 = 0;
      local_f8 = 0.0;
      uStack_f0 = 0;
    }
    else {
      iVar3 = 0;
      local_f8 = 0.0;
      uStack_f0 = 0;
      iVar9 = 0;
      local_108 = 0.0;
      uStack_100 = 0;
      do {
        ppAVar8 = (pMVar4->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while( true ) {
          if (ppAVar8 ==
              (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pAVar7 = (Atom *)0x0;
          }
          else {
            pAVar7 = *ppAVar8;
          }
          if (pAVar7 == (Atom *)0x0) break;
          local_88[0].at_ = pAVar7->atomType_;
          bVar2 = FixedChargeAdapter::isFixedCharge(local_88);
          local_150 = 0.0;
          if (bVar2) {
            local_150 = FixedChargeAdapter::getCharge(local_88);
          }
          local_40.at_ = pAVar7->atomType_;
          bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_40);
          if (bVar2) {
            local_150 = local_150 +
                        *(double *)
                         (*(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                            currentSnapshot_->atomData).flucQPos.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                   (pAVar7->super_StuntDouble).storage_) +
                         (long)(pAVar7->super_StuntDouble).localIndex_ * 8);
          }
          lVar5 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar7->super_StuntDouble).storage_);
          lVar6 = (long)(pAVar7->super_StuntDouble).localIndex_;
          pdVar1 = (double *)(lVar5 + lVar6 * 0x18);
          local_128.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_128.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_128.super_Vector<double,_3U>.data_[2] = *(double *)(lVar5 + 0x10 + lVar6 * 0x18);
          Snapshot::wrapVector(this_00,&local_128);
          lVar5 = 0;
          do {
            local_128.super_Vector<double,_3U>.data_[lVar5] =
                 local_128.super_Vector<double,_3U>.data_[lVar5] * 1e-10;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          local_150 = local_150 * 1.60217733e-19;
          if (0.0 <= local_150) {
            if (0.0 < local_150) {
              lVar5 = 0;
              do {
                local_c8[lVar5] = local_128.super_Vector<double,_3U>.data_[lVar5] + local_c8[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              local_108 = local_108 + local_150;
              iVar3 = iVar3 + 1;
            }
          }
          else {
            lVar5 = 0;
            do {
              local_a8[lVar5] = local_128.super_Vector<double,_3U>.data_[lVar5] + local_a8[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            local_f8 = local_f8 - local_150;
            iVar9 = iVar9 + 1;
          }
          bVar2 = AtomType::isDipole(pAVar7->atomType_);
          if (bVar2) {
            lVar6 = (long)(pAVar7->super_StuntDouble).localIndex_;
            lVar5 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).dipole.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (pAVar7->super_StuntDouble).storage_);
            local_e8[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar6 * 0x18);
            pdVar1 = (double *)(lVar5 + lVar6 * 0x18);
            local_e8[0] = *pdVar1;
            local_e8[1] = pdVar1[1];
            local_148.super_Vector<double,_3U>.data_[0] = 0.0;
            local_148.super_Vector<double,_3U>.data_[1] = 0.0;
            local_148.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar5 = 0;
            do {
              local_148.super_Vector<double,_3U>.data_[lVar5] = local_e8[lVar5] * 3.33564095198e-30;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            lVar5 = 0;
            do {
              local_68[lVar5] = local_148.super_Vector<double,_3U>.data_[lVar5] + local_68[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          ppAVar8 = ppAVar8 + 1;
        }
        pMVar4 = SimInfo::nextMolecule(local_48->info_,&local_38);
      } while (pMVar4 != (Molecule *)0x0);
    }
    __return_storage_ptr__ = local_50;
    local_148.super_Vector<double,_3U>.data_[2] = local_68[2];
    local_148.super_Vector<double,_3U>.data_[0] = local_68[0];
    local_148.super_Vector<double,_3U>.data_[1] = local_68[1];
    if ((0 < iVar3) && (0 < iVar9)) {
      lVar5 = 0;
      do {
        local_c8[lVar5] = local_c8[lVar5] / (double)iVar3;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        local_a8[lVar5] = local_a8[lVar5] / (double)iVar9;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    local_88[0].at_ = (AtomType *)0x0;
    local_88[1].at_ = (AtomType *)0x0;
    local_88[2].at_ = (AtomType *)0x0;
    lVar5 = 0;
    do {
      local_88[lVar5].at_ = (AtomType *)(local_c8[lVar5] - local_a8[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    lVar5 = 0;
    do {
      local_e8[lVar5] =
           (double)local_88[lVar5].at_ *
           (double)(~-(ulong)(local_f8 <= local_108) & (ulong)local_108 |
                   (ulong)local_f8 & -(ulong)(local_f8 <= local_108));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      local_148.super_Vector<double,_3U>.data_[lVar5] =
           local_e8[lVar5] + local_148.super_Vector<double,_3U>.data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    Snapshot::setSystemDipole(this_00,&local_148);
  }
  Snapshot::getSystemDipole(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getSystemDipole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemDipole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipoleVector(0.0);
      Vector3d nPos(0.0);
      Vector3d pPos(0.0);
      RealType nChg(0.0);
      RealType pChg(0.0);
      int nCount = 0;
      int pCount = 0;

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          if (charge < 0.0) {
            nPos += ri;
            nChg -= charge;
            nCount++;
          } else if (charge > 0.0) {
            pPos += ri;
            pChg += charge;
            pCount++;
          }

          if (atom->isDipole()) {
            dipoleVector += atom->getDipole() * debyeToCm;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &pChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &pCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, pPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, nPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, dipoleVector.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      // first load the accumulated dipole moment (if dipoles were present)
      Vector3d boxDipole = dipoleVector;
      // now include the dipole moment due to charges
      // use the lesser of the positive and negative charge totals
      RealType chg_value = nChg <= pChg ? nChg : pChg;

      // find the average positions
      if (pCount > 0 && nCount > 0) {
        pPos /= pCount;
        nPos /= nCount;
      }

      // dipole is from the negative to the positive (physics notation)
      boxDipole += (pPos - nPos) * chg_value;
      snap->setSystemDipole(boxDipole);
    }

    return snap->getSystemDipole();
  }